

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkreply.cpp
# Opt level: O0

int __thiscall QNetworkReply::qt_metacall(QNetworkReply *this,Call _c,int _id,void **_a)

{
  uint in_EDX;
  int in_ESI;
  Call in_EDI;
  void **in_stack_000000b0;
  int in_stack_000000b8;
  Call in_stack_000000bc;
  QObject *in_stack_000000c0;
  undefined4 local_18;
  undefined4 local_4;
  
  local_18 = QIODevice::qt_metacall(in_EDI,in_ESI,(void **)(ulong)in_EDX);
  local_4 = local_18;
  if (-1 < local_18) {
    if (in_ESI == 0) {
      if (local_18 < 0xe) {
        qt_static_metacall(in_stack_000000c0,in_stack_000000bc,in_stack_000000b8,in_stack_000000b0);
      }
      local_18 = local_18 + -0xe;
    }
    if (in_ESI == 7) {
      if (local_18 < 0xe) {
        qt_static_metacall(in_stack_000000c0,in_stack_000000bc,in_stack_000000b8,in_stack_000000b0);
      }
      local_18 = local_18 + -0xe;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int QNetworkReply::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QIODevice::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 14)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 14;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 14)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 14;
    }
    return _id;
}